

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::CreateRejectedPromise
              (Var resolution,ScriptContext *scriptContext,Var promiseConstructor)

{
  JavascriptLibrary *this;
  JavascriptPromiseCapability *this_00;
  Var pvVar1;
  JavascriptPromiseCapability *promiseCapability;
  Var promiseConstructor_local;
  ScriptContext *scriptContext_local;
  Var resolution_local;
  
  promiseCapability = (JavascriptPromiseCapability *)promiseConstructor;
  if (promiseConstructor == (Var)0x0) {
    this = ScriptContext::GetLibrary(scriptContext);
    promiseCapability =
         (JavascriptPromiseCapability *)
         JavascriptLibraryBase::GetPromiseConstructor(&this->super_JavascriptLibraryBase);
  }
  this_00 = NewPromiseCapability(promiseCapability,scriptContext);
  pvVar1 = JavascriptPromiseCapability::GetReject(this_00);
  TryCallResolveOrRejectHandler(pvVar1,resolution,scriptContext);
  pvVar1 = JavascriptPromiseCapability::GetPromise(this_00);
  return pvVar1;
}

Assistant:

Var JavascriptPromise::CreateRejectedPromise(Var resolution, ScriptContext* scriptContext, Var promiseConstructor)
    {
        if (promiseConstructor == nullptr)
        {
            promiseConstructor = scriptContext->GetLibrary()->GetPromiseConstructor();
        }

        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(promiseConstructor, scriptContext);

        TryCallResolveOrRejectHandler(promiseCapability->GetReject(), resolution, scriptContext);

        return promiseCapability->GetPromise();
    }